

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlsafe_b64.c
# Opt level: O1

size_t urlsafe_b64_encode2(void *src,size_t srcSize,b64_char_t *dest,size_t destLen,uint flags,
                          int lineLen,B64_RC *rc)

{
  B64_RC *rc_00;
  size_t sVar1;
  B64_RC rc_;
  B64_RC local_4;
  
  switch(flags & 0xf) {
  case 0:
    if (-1 < lineLen) break;
  case 2:
    lineLen = 0x40;
    break;
  case 1:
    lineLen = 0;
    break;
  case 3:
    lineLen = 0x4c;
    break;
  default:
    __assert_fail("(0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                  ,0x1ee,
                  "size_t urlsafe_b64_encode2(const void *, size_t, b64_char_t *, size_t, unsigned int, int, B64_RC *)"
                 );
  }
  if ((lineLen & 3U) != 0) {
    __assert_fail("(0 == (lineLen % 4))",
                  "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                  ,500,
                  "size_t urlsafe_b64_encode2(const void *, size_t, b64_char_t *, size_t, unsigned int, int, B64_RC *)"
                 );
  }
  rc_00 = &local_4;
  if (rc != (B64_RC *)0x0) {
    rc_00 = rc;
  }
  sVar1 = urlsafe_b64_encode_((uchar *)src,srcSize,dest,destLen,lineLen,rc_00);
  return sVar1;
}

Assistant:

size_t urlsafe_b64_encode2(
    void const* src
,   size_t      srcSize
,   b64_char_t* dest
,   size_t      destLen
,   unsigned    flags
,   int         lineLen /* = -1 */
,   B64_RC*     rc     /* = NULL */
)
{
    /* Use Null Object (Variable) here for rc, so do not need to check
     * elsewhere
     */
    B64_RC  rc_;
    if(NULL == rc)
    {
        rc = &rc_;
    }

    switch(B64_F_LINE_LEN_MASK & flags)
    {
        case    B64_F_LINE_LEN_USE_PARAM:
            if(lineLen >= 0)
            {
                break;
            }
            /* Fall through to 64 */
        case    B64_F_LINE_LEN_64:
            lineLen = 64;
            break;
        case    B64_F_LINE_LEN_76:
            lineLen = 76;
            break;
        default:
            B64_ENFORCE_PRECONDITION(0, "Bad line length flag specified to b64_encode2()");
        case    B64_F_LINE_LEN_INFINITE:
            lineLen = 0;
            break;
    }

    B64_ENFORCE_PRECONDITION(0 == (lineLen % 4), "Bad line length flag specified to b64_encode2()");

    return urlsafe_b64_encode_((unsigned char const*)src, srcSize, dest, destLen, (unsigned)lineLen, rc);
}